

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.h
# Opt level: O2

string * google::protobuf::compiler::java::AnnotationFileName<google::protobuf::ServiceDescriptor>
                   (string *__return_storage_ptr__,ServiceDescriptor *descriptor,string *suffix)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)descriptor,
                 suffix);
  std::operator+(__return_storage_ptr__,&local_30,".java.pb.meta");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string AnnotationFileName(const Descriptor* descriptor, const string& suffix) {
  return descriptor->name() + suffix + ".java.pb.meta";
}